

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_trace_file.c
# Opt level: O3

mFILE * find_file_url(char *file,char *url)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  hFILE *fp;
  mFILE *mf;
  ssize_t sVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  char *__dest;
  char *pcVar9;
  char buf [8192];
  char local_2038 [8200];
  
  __dest = local_2038;
  pcVar9 = local_2038;
  sVar4 = strlen(file);
  lVar8 = (long)(0x1ffe - (int)sVar4);
  cVar1 = *url;
  if (0 < lVar8 && cVar1 != '\0') {
    do {
      if ((cVar1 == '%') && (url[1] == 's')) {
        url = url + 1;
        strcpy(__dest,file);
        sVar4 = strlen(__dest);
        pcVar9 = __dest + sVar4;
      }
      else {
        *__dest = cVar1;
        pcVar9 = __dest + 1;
      }
      cVar1 = url[1];
    } while ((cVar1 != '\0') &&
            (url = url + 1, __dest = pcVar9, (long)pcVar9 - (long)local_2038 < lVar8));
  }
  *pcVar9 = '\0';
  fp = hopen(local_2038,"r");
  if (fp != (hFILE *)0x0) {
    mf = mfcreate((char *)0x0,0);
    if (mf == (mFILE *)0x0) {
      return (mFILE *)0x0;
    }
    do {
      uVar7 = (long)fp->end - (long)fp->begin;
      sVar4 = 0x2000;
      if (uVar7 < 0x2000) {
        sVar4 = uVar7;
      }
      memcpy(local_2038,fp->begin,sVar4);
      fp->begin = fp->begin + sVar4;
      uVar2 = 0x2000;
      if (uVar7 < 0x2000) {
        sVar5 = hread2(fp,local_2038,0x2000,sVar4);
        uVar2 = (uint)sVar5;
        if ((int)uVar2 < 1) {
          iVar3 = hclose(fp);
          if (-1 < iVar3) {
            mrewind(mf);
            return mf;
          }
          goto LAB_0013519b;
        }
      }
      sVar6 = mfwrite(local_2038,(ulong)(uVar2 & 0x7fffffff),1,mf);
    } while (sVar6 != 0);
    hclose_abruptly(fp);
LAB_0013519b:
    mfdestroy(mf);
  }
  return (mFILE *)0x0;
}

Assistant:

mFILE *find_file_url(char *file, char *url) {
    char buf[8192], *cp;
    mFILE *mf = NULL;
    int maxlen = 8190 - strlen(file), len;
    hFILE *hf;

    /* Expand %s for the trace name */
    for (cp = buf; *url && cp - buf < maxlen; url++) {
	if (*url == '%' && *(url+1) == 's') {
	    url++;
	    cp += strlen(strcpy(cp, file));
	} else {
	    *cp++ = *url;
	}
    }
    *cp++ = 0;

    if (!(hf = hopen(buf, "r")))
	return NULL;

    if (NULL == (mf = mfcreate(NULL, 0)))
	return NULL;
    while ((len = hread(hf, buf, 8192)) > 0) {
	if (mfwrite(buf, len, 1, mf) <= 0) {
	    hclose_abruptly(hf);
	    mfdestroy(mf);
	    return NULL;
	}
    }
    if (hclose(hf) < 0) {
	mfdestroy(mf);
	return NULL;
    }

    mrewind(mf);
    return mf;
}